

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O1

void brngHMACStepR(void *buf,size_t count,void *state)

{
  long *plVar1;
  void *pvVar2;
  ulong count_00;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  plVar1 = (long *)((long)state + 0x90);
  count_00 = *(ulong *)((long)state + 0x90);
  if (count_00 != 0) {
    if (count <= count_00) {
      memCopy(buf,(void *)((long)plVar1 - count_00),count);
      lVar5 = *plVar1 - count;
      goto LAB_00134e92;
    }
    memCopy(buf,(void *)((long)plVar1 - count_00),count_00);
    count = count - *plVar1;
    buf = (void *)((long)buf + *plVar1);
    *plVar1 = 0;
  }
  if (0x1f < count) {
    pvVar2 = (void *)((long)state + 0x98);
    do {
      sVar3 = beltHMAC_keep();
      sVar4 = beltHMAC_keep();
      memCopy(pvVar2,(void *)(sVar3 + (long)pvVar2),sVar4);
      beltHMACStepA((octet *)((long)state + 0x50),0x20,pvVar2);
      beltHMACStepG((octet *)((long)state + 0x50),pvVar2);
      beltHMACStepA(*state,*(size_t *)((long)state + 0x48),pvVar2);
      beltHMACStepG((octet *)buf,pvVar2);
      buf = (void *)((long)buf + 0x20);
      count = count - 0x20;
    } while (0x1f < count);
  }
  if (count == 0) {
    return;
  }
  pvVar2 = (void *)((long)state + 0x98);
  sVar3 = beltHMAC_keep();
  sVar4 = beltHMAC_keep();
  memCopy(pvVar2,(void *)((long)state + sVar3 + 0x98),sVar4);
  beltHMACStepA((octet *)((long)state + 0x50),0x20,pvVar2);
  beltHMACStepG((octet *)((long)state + 0x50),pvVar2);
  beltHMACStepA(*state,*(size_t *)((long)state + 0x48),pvVar2);
  beltHMACStepG((octet *)((long)state + 0x70),pvVar2);
  memCopy(buf,(octet *)((long)state + 0x70),count);
  lVar5 = 0x20 - count;
LAB_00134e92:
  *plVar1 = lVar5;
  return;
}

Assistant:

void brngHMACStepR(void* buf, size_t count, void* state)
{
	brng_hmac_st* s = (brng_hmac_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngHMAC_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- beltHMAC(key, r || iv)
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(buf, s->state_ex);
		// next
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- left(beltHMAC(key, r || iv))
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(s->block, s->state_ex);
		memCopy(buf, s->block, count);
		// next
		s->reserved = 32 - count;
	}
}